

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

char * libxml_buildMessage(char *msg,__va_list_tag *ap)

{
  int iVar1;
  char *__s;
  
  __s = (char *)(*_xmlMalloc)(1000);
  if (__s != (char *)0x0) {
    iVar1 = vsnprintf(__s,999,msg,ap);
    if (0x3e5 < iVar1) {
      __s[999] = '\0';
    }
  }
  return __s;
}

Assistant:

static char *
libxml_buildMessage(const char *msg, va_list ap)
{
    int chars;
    char *str;

    str = (char *) xmlMalloc(1000);
    if (str == NULL)
        return NULL;

    chars = vsnprintf(str, 999, msg, ap);
    if (chars >= 998)
        str[999] = 0;

    return str;
}